

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

bool __thiscall clipp::parsing_result::any_error(parsing_result *this)

{
  bool bVar1;
  size_type sVar2;
  
  sVar2 = unmapped_args_count(this);
  if ((sVar2 == 0) &&
     ((this->missing_).
      super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->missing_).
      super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = any_blocked(this);
    if (!bVar1) {
      bVar1 = any_conflict(this);
      if (!bVar1) {
        bVar1 = any_bad_repeat(this);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool any_error() const noexcept {
        return unmapped_args_count() > 0 || !missing().empty() ||
               any_blocked() || any_conflict() || any_bad_repeat();
    }